

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_parse_addr(ngx_pool_t *pool,ngx_addr_t *addr,u_char *text,size_t len)

{
  in_addr_t iVar1;
  ngx_int_t nVar2;
  sockaddr *psVar3;
  sockaddr_in6 *sin6;
  in6_addr inaddr6;
  sockaddr_in *sin;
  ngx_uint_t family;
  socklen_t sStack_30;
  in_addr_t inaddr;
  size_t len_local;
  u_char *text_local;
  ngx_addr_t *addr_local;
  ngx_pool_t *pool_local;
  
  memset(&sin6,0,0x10);
  iVar1 = ngx_inet_addr(text,len);
  if (iVar1 == 0xffffffff) {
    nVar2 = ngx_inet6_addr(text,len,(u_char *)&sin6);
    if (nVar2 != 0) {
      return -5;
    }
    sin = (sockaddr_in *)0xa;
    _sStack_30 = 0x1c;
  }
  else {
    sin = (sockaddr_in *)0x2;
    _sStack_30 = 0x10;
  }
  psVar3 = (sockaddr *)ngx_pcalloc(pool,_sStack_30);
  addr->sockaddr = psVar3;
  if (addr->sockaddr == (sockaddr *)0x0) {
    pool_local = (ngx_pool_t *)0xffffffffffffffff;
  }
  else {
    addr->sockaddr->sa_family = (ushort)(byte)sin;
    addr->socklen = sStack_30;
    if (sin == (sockaddr_in *)0xa) {
      psVar3 = addr->sockaddr;
      *(sockaddr_in6 **)(psVar3->sa_data + 6) = sin6;
      psVar3[1].sa_family = inaddr6.__in6_u._0_2_;
      psVar3[1].sa_data[0] = inaddr6.__in6_u._2_1_;
      psVar3[1].sa_data[1] = inaddr6.__in6_u._3_1_;
      psVar3[1].sa_data[2] = inaddr6.__in6_u._4_1_;
      psVar3[1].sa_data[3] = inaddr6.__in6_u._5_1_;
      psVar3[1].sa_data[4] = inaddr6.__in6_u._6_1_;
      psVar3[1].sa_data[5] = inaddr6.__in6_u._7_1_;
    }
    else {
      *(in_addr_t *)(addr->sockaddr->sa_data + 2) = iVar1;
    }
    pool_local = (ngx_pool_t *)0x0;
  }
  return (ngx_int_t)pool_local;
}

Assistant:

ngx_int_t
ngx_parse_addr(ngx_pool_t *pool, ngx_addr_t *addr, u_char *text, size_t len)
{
    in_addr_t             inaddr;
    ngx_uint_t            family;
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct in6_addr       inaddr6;
    struct sockaddr_in6  *sin6;

    /*
     * prevent MSVC8 warning:
     *    potentially uninitialized local variable 'inaddr6' used
     */
    ngx_memzero(&inaddr6, sizeof(struct in6_addr));
#endif

    inaddr = ngx_inet_addr(text, len);

    if (inaddr != INADDR_NONE) {
        family = AF_INET;
        len = sizeof(struct sockaddr_in);

#if (NGX_HAVE_INET6)
    } else if (ngx_inet6_addr(text, len, inaddr6.s6_addr) == NGX_OK) {
        family = AF_INET6;
        len = sizeof(struct sockaddr_in6);

#endif
    } else {
        return NGX_DECLINED;
    }

    addr->sockaddr = ngx_pcalloc(pool, len);
    if (addr->sockaddr == NULL) {
        return NGX_ERROR;
    }

    addr->sockaddr->sa_family = (u_char) family;
    addr->socklen = len;

    switch (family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) addr->sockaddr;
        ngx_memcpy(sin6->sin6_addr.s6_addr, inaddr6.s6_addr, 16);
        break;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) addr->sockaddr;
        sin->sin_addr.s_addr = inaddr;
        break;
    }

    return NGX_OK;
}